

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O1

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long in_FS_OFFSET;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_message_on_completion == true) {
    tinyformat::format<std::__cxx11::string>
              (&local_38,(tinyformat *)"%s completed",(char *)&this->m_title,in_RCX);
    Log(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) goto LAB_002e5ae4;
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"completed","");
    Log(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) goto LAB_002e5ae4;
  }
  operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
LAB_002e5ae4:
  pcVar1 = (this->m_title)._M_dataplus._M_p;
  paVar2 = &(this->m_title).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_prefix)._M_dataplus._M_p;
  paVar2 = &(this->m_prefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

~Timer()
    {
        if (m_message_on_completion) {
            this->Log(strprintf("%s completed", m_title));
        } else {
            this->Log("completed");
        }
    }